

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O0

void __thiscall ktxApp::writeId(ktxApp *this,ostream *dst,bool chktest)

{
  ostream *poVar1;
  byte in_DL;
  ostream *in_RSI;
  long in_RDI;
  string *local_30;
  
  poVar1 = std::operator<<(in_RSI,(string *)(in_RDI + 8));
  std::operator<<(poVar1," ");
  if (((in_DL & 1) == 0) || (*(int *)(*(long *)(in_RDI + 0x38) + 0x38) == 0)) {
    local_30 = *(string **)(in_RDI + 0x28);
  }
  else {
    local_30 = *(string **)(in_RDI + 0x30);
  }
  std::operator<<(in_RSI,local_30);
  return;
}

Assistant:

void writeId(std::ostream& dst, bool chktest) {
        dst << name << " ";
        dst << (!chktest || !options.test ? version : defaultVersion);
    }